

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int __thiscall
IDisk::FindEndOfWeakArea
          (IDisk *this,int side,int track,uint *current_search_revolution,uint *next_correct_index,
          uint nb_used_revolutions,int *rev_to_use,bool *revolution_wrecked)

{
  Revolution *pRVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  Side *pSVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  uint local_184;
  int inner_revolution_to_use;
  IDisk *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uint ending_search [16];
  int tmp_buffer [16];
  uint inner_search_end [16];
  
  uVar9 = (ulong)nb_used_revolutions;
  if (nb_used_revolutions == 0) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = 0xffffffff;
    uVar10 = 0;
    do {
      if (revolution_wrecked[uVar10] == false) {
        ending_search[uVar10] = next_correct_index[uVar10];
        if (uVar5 == 0xffffffff) {
          uVar5 = (uint)uVar10;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (uVar5 == 0xffffffff) {
    uVar5 = 0;
  }
  else {
    uVar7 = ending_search[(int)uVar5];
    uVar14 = current_search_revolution[(int)uVar5];
    iVar8 = uVar7 - uVar14;
    local_184 = 0;
    if (iVar8 != 0xe) {
      pSVar11 = this->side_ + side;
      local_108 = (ulong)(nb_used_revolutions - 1);
      bVar4 = false;
      local_184 = 0;
      uVar16 = 0;
      do {
        local_110 = uVar9;
        if (((uVar7 < uVar14 + 0xe) || (ending_search[(int)uVar5] - uVar14 <= uVar16)) ||
           (iVar8 - uVar16 <= local_184)) break;
        uVar14 = uVar14 + uVar16;
        tmp_buffer[(int)uVar5] = uVar14;
        if (nb_used_revolutions != 0) {
          uVar10 = 0;
          do {
            if (uVar5 != uVar10) {
              tmp_buffer[uVar10] = -1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          if (nb_used_revolutions != 0) {
            local_100 = (ulong)(uVar16 + 0x40);
            iVar8 = uVar16 - 0x40;
            if (uVar16 < 0x40) {
              iVar8 = 0;
            }
            uVar10 = 0;
            do {
              if ((uVar10 != uVar5) && (revolution_wrecked[uVar10] == false)) {
                uVar12 = uVar16 + 0x40 + current_search_revolution[uVar10];
                uVar6 = current_search_revolution[uVar10] + iVar8;
                uVar15 = ending_search[uVar10] - 0xf;
                if (uVar12 < ending_search[uVar10] - 0xf) {
                  uVar15 = uVar12;
                }
                if (uVar6 < uVar15) {
                  pRVar1 = pSVar11->tracks[track].revolution;
                  uVar12 = pRVar1[(int)uVar5].size;
                  uVar13 = (ulong)uVar6;
                  bVar21 = false;
                  do {
                    if ((uVar14 + 0xe < uVar12) && (uVar6 + 0xe < pRVar1[uVar10].size)) {
                      puVar2 = pRVar1[(int)uVar5].bitfield;
                      puVar3 = pRVar1[uVar10].bitfield;
                      if (*(long *)(puVar2 + (ulong)uVar14 + 6) != *(long *)(puVar3 + uVar13 + 6) ||
                          *(long *)(puVar2 + uVar14) != *(long *)(puVar3 + uVar13)) {
                        bVar22 = true;
                        uVar19 = 0;
                        do {
                          if (puVar2[uVar14 + (int)uVar19] !=
                              puVar3[(uint)((int)uVar13 + (int)uVar19)]) {
                            bVar22 = bVar4;
                          }
                          bVar20 = uVar19 < 0xc;
                          uVar19 = uVar19 + 2;
                        } while (bVar20);
                        if (!bVar22) goto LAB_0014b808;
                      }
                      tmp_buffer[uVar10] = (int)uVar13;
                      bVar21 = true;
                    }
                    else {
                      bVar21 = false;
                    }
LAB_0014b808:
                    uVar13 = uVar13 + 1;
                  } while ((uVar13 < uVar15) && (uVar6 = uVar6 + 1, !bVar21));
                }
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar9);
          }
        }
        if (nb_used_revolutions < 2) {
LAB_0014b870:
          if (nb_used_revolutions == 0) {
            iVar8 = -1;
            uVar14 = 0;
          }
          else {
            uVar13 = 0xffffffff;
            lVar17 = 1;
            uVar14 = 0;
            uVar10 = 0;
            do {
              uVar19 = uVar10 + 1;
              if (uVar19 < uVar9) {
                lVar18 = lVar17;
                do {
                  if ((revolution_wrecked[uVar10] == false) && (revolution_wrecked[lVar18] == false)
                     ) {
                    uVar6 = next_correct_index[uVar10] - tmp_buffer[uVar10];
                    uVar15 = next_correct_index[lVar18] - tmp_buffer[lVar18];
                    if (uVar6 <= uVar15) {
                      uVar15 = uVar6;
                    }
                    pRVar1 = pSVar11->tracks[track].revolution;
                    bVar21 = true;
                    uVar6 = 0;
                    do {
                      bVar22 = pRVar1[uVar10].bitfield[uVar6 + tmp_buffer[uVar10]] !=
                               pRVar1[lVar18].bitfield[uVar6 + tmp_buffer[lVar18]];
                      if (bVar22) {
                        bVar21 = bVar4;
                      }
                      uVar12 = uVar6 + 2;
                      if (bVar22) {
                        uVar12 = uVar6;
                      }
                      uVar6 = uVar12;
                    } while ((bVar21) && (uVar6 <= uVar15));
                    if (uVar6 < uVar15) {
                      uVar15 = uVar6;
                    }
                    bVar21 = uVar14 < uVar15;
                    if (uVar14 <= uVar15) {
                      uVar14 = uVar15;
                    }
                    if (bVar21) {
                      uVar13 = uVar10 & 0xffffffff;
                    }
                  }
                  lVar18 = lVar18 + 1;
                } while ((uint)lVar18 != nb_used_revolutions);
              }
              iVar8 = (int)uVar13;
              lVar17 = lVar17 + 1;
              uVar10 = uVar19;
            } while (uVar19 != uVar9);
          }
          if ((local_184 < uVar14) &&
             (*rev_to_use = iVar8, local_184 = uVar14, nb_used_revolutions != 0)) {
            lVar17 = 8;
            uVar10 = 0;
            do {
              if (revolution_wrecked[uVar10] == false) {
                ending_search[uVar10] = tmp_buffer[uVar10] + uVar14;
                uVar15 = *(uint *)((long)&(pSVar11->tracks[track].revolution)->bitfield + lVar17);
                if (uVar15 < tmp_buffer[uVar10] + uVar14) {
                  if (local_108 == uVar10) {
                    revolution_wrecked[uVar10] = true;
                  }
                  else {
                    ending_search[uVar10] = uVar15;
                  }
                }
              }
              uVar10 = uVar10 + 1;
              lVar17 = lVar17 + 0x30;
            } while (uVar9 != uVar10);
          }
        }
        else {
          bVar21 = true;
          uVar10 = 1;
          do {
            if ((revolution_wrecked[uVar10] == false) && (tmp_buffer[uVar10] == -1)) {
              bVar21 = bVar4;
            }
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          if (bVar21) goto LAB_0014b870;
        }
        uVar16 = uVar16 + 1;
        uVar14 = current_search_revolution[(int)uVar5];
        iVar8 = uVar7 - uVar14;
      } while (uVar16 < iVar8 - 0xeU);
    }
    uVar5 = 0;
    if (local_184 != 0) {
      if (nb_used_revolutions != 0) {
        uVar9 = 0;
        do {
          if (revolution_wrecked[uVar9] == false) {
            next_correct_index[uVar9] = ending_search[uVar9];
          }
          uVar9 = uVar9 + 1;
        } while (nb_used_revolutions != uVar9);
      }
      if (nb_used_revolutions != 0) {
        uVar9 = 0;
        do {
          if (revolution_wrecked[uVar9] == false) {
            inner_search_end[uVar9] = ending_search[uVar9] - local_184;
          }
          uVar9 = uVar9 + 1;
        } while (nb_used_revolutions != uVar9);
      }
      inner_revolution_to_use = -1;
      local_118 = this;
      uVar7 = FindEndOfWeakArea(this,side,track,current_search_revolution,inner_search_end,
                                nb_used_revolutions,&inner_revolution_to_use,revolution_wrecked);
      uVar5 = local_184;
      if (uVar7 != 0) {
        if (nb_used_revolutions != 0) {
          uVar9 = 0;
          do {
            if (revolution_wrecked[uVar9] == false) {
              next_correct_index[uVar9] = inner_search_end[uVar9];
            }
            uVar9 = uVar9 + 1;
          } while (nb_used_revolutions != uVar9);
        }
        *rev_to_use = inner_revolution_to_use;
        uVar5 = uVar7;
      }
    }
  }
  return uVar5;
}

Assistant:

int IDisk::FindEndOfWeakArea(int side, int track, unsigned int* current_search_revolution, unsigned int* next_correct_index,
                             unsigned int nb_used_revolutions, int* rev_to_use, bool revolution_wrecked[16])
{
   // Init : The ending is, by default, pNextCorrectIndex
   unsigned int ending_search[16];
   unsigned int best_count = 0;
   int tmp_buffer[16];

   int refrev = -1;

   for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
   {
      if (!revolution_wrecked[rev])
      {
         ending_search[rev] = next_correct_index[rev];
         if (refrev == -1)
            refrev = rev;
      }
   }

   if (refrev == -1) return 0;

   // Rev0 is the reference.
   unsigned int maxRev0 = ending_search[refrev];

   for (unsigned int index = 0; index < maxRev0 - current_search_revolution[refrev] - RECOVER_SIZE
        && index < (ending_search[refrev] - current_search_revolution[refrev])
        && best_count < maxRev0 - current_search_revolution[refrev] - index
        && (maxRev0 >= (current_search_revolution[refrev] + RECOVER_SIZE)); index++)
   {
      tmp_buffer[refrev] = index + current_search_revolution[refrev];
      for (unsigned int i = 0; i < nb_used_revolutions; i++) { if (refrev != i) tmp_buffer[i] = -1; }
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (refrev != rev && !revolution_wrecked[rev])
         {
            // Walk every reference until we find something that is same (at least 14 bits correct)
            unsigned int min = (index < MOVING_AREA)
                                  ? (current_search_revolution[rev])
                                  : (current_search_revolution[rev] + index - MOVING_AREA);
            unsigned int max = current_search_revolution[rev] + index + MOVING_AREA;
            if (max > ending_search[rev] - RECOVER_SIZE - 1) max = ending_search[rev] - RECOVER_SIZE - 1;
            bool found = false;
            for (unsigned int i = min; i < max && !found; i++)
            {
               if (side_[side].tracks[track].revolution[refrev].size <= current_search_revolution[refrev] + index + RECOVER_SIZE
                  || side_[side].tracks[track].revolution[rev].size <= i + RECOVER_SIZE)
               {
                  found = false;
               }
               else
               {
                  if (memcmp(&side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index],
                             &side_[side].tracks[track].revolution[rev].bitfield[i], RECOVER_SIZE) == 0)
                  {
                     tmp_buffer[rev] = i;
                     found = true;
                  }
                     // Half (one on 2) is the same - For all those dump with half datas (clock or data)
                  else
                  {
                     bool ok = true;
                     for (int i2 = 0; i2 < RECOVER_SIZE; i2 += 2)
                     {
                        if (side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index + i2
                           ] != side_[side].tracks[track].revolution[rev].bitfield[i + i2]
                        )
                        {
                           ok = false;
                        }
                     }
                     if (ok)
                     {
                        tmp_buffer[rev] = i;
                        found = true;
                        // Only half is correct
                     }
                  }
               }
            }
         }
      }

      // All Tmp != 0 ?
      bool ok = true;
      for (unsigned int rev = 1; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev] && (tmp_buffer[rev] == -1))
         {
            ok = false;
         }
      }
      // Found ! Count how many bits are correct.
      if (ok)
      {
         unsigned int count = 0;
         int revolution_count = -1;
         int bit_corrects[16][16];
         for (unsigned int i = 0; i < nb_used_revolutions; i++)
         {
            for (unsigned int j = i + 1; j < nb_used_revolutions; j++)
            {
               if (!revolution_wrecked[i] && !revolution_wrecked[j])
               {
                  // Comparaison des revolutions i et j
                  bool revolution_comp_ok = true;
                  bit_corrects[i][j] = 0;
                  unsigned int localcount = 0;
                  // Max comp : pTmp -> pNextCorrectIndex
                  unsigned int max_comp_1 = next_correct_index[i] - tmp_buffer[i];
                  unsigned int max_comp_2 = next_correct_index[j] - tmp_buffer[j];
                  unsigned int min_comp = std::min(max_comp_1, max_comp_2);

                  while (revolution_comp_ok && localcount <= min_comp)
                  {
                     // Compare
                     if (side_[side].tracks[track].revolution[i].bitfield[tmp_buffer[i] + localcount] != side_[side].tracks[
                        track].revolution[j].bitfield[tmp_buffer[j] + localcount])
                     {
                        revolution_comp_ok = false;
                     }
                     else
                     {
                        localcount += 2;
                     }
                  }
                  if (localcount > min_comp) localcount = min_comp;
                  bit_corrects[i][j] = localcount;
                  if (count < localcount)
                  {
                     count = localcount;
                     revolution_count = i;
                  }
               }
            }
         }

         // Better than the previous one ?
         if (count > best_count)
         {
            // Yes : set it as the best candidate
            best_count = count;
            *rev_to_use = revolution_count;
            // In all case, set the end of the search to the end of this set
            for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
            {
               if (!revolution_wrecked[rev])
               {
                  ending_search[rev] = tmp_buffer[rev] + count;
                  if (ending_search[rev] > side_[side].tracks[track].revolution[rev].size)
                  {
                     if (rev == nb_used_revolutions - 1)
                        revolution_wrecked[rev] = true;
                     else
                        ending_search[rev] = side_[side].tracks[track].revolution[rev].size;
                  }
               }
            }
         }
      }
   }

   if (best_count > 0)
   {
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            next_correct_index[rev] = ending_search[rev];
      }

      // Check recursively for inner area search, from initial current_search_revolution to pEndingSearch-bestCount
      unsigned int inner_search_end[16];
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            inner_search_end[rev] = ending_search[rev] - best_count;
      }

      int inner_revolution_to_use = -1;
      int inner_best_count = FindEndOfWeakArea(side, track, current_search_revolution, inner_search_end, nb_used_revolutions,
                                             &inner_revolution_to_use, revolution_wrecked);
      if (inner_best_count != 0)
      {
         // Return these datas
         for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
         {
            if (!revolution_wrecked[rev])
               next_correct_index[rev] = inner_search_end[rev];
         }
         *rev_to_use = inner_revolution_to_use;

         return inner_best_count;
      }
      // Nothing found : Return our datas
      return best_count;
   }
   return best_count;
}